

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerDivI4Common(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  IRType IVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *target_01;
  Opnd *this_00;
  Opnd *testSrc1;
  Opnd *pOVar8;
  long value;
  int64 iVar9;
  Opnd *local_b8;
  bool needsMinOverNeg1Check;
  int64 intMin;
  LabelInstr *minIntLabel;
  bool isWasm;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  LabelInstr *doneLabel;
  LabelInstr *divLabel;
  LabelInstr *div0Label;
  bool isRem;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69c9,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((((instr->m_opcode != Rem_I4) && (instr->m_opcode != Div_I4)) && (instr->m_opcode != RemU_I4))
     && (instr->m_opcode != DivU_I4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69cb,
                       "((instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) || (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4))"
                       ,
                       "(instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) || (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pJVar7 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69cc,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = true;
  if (instr->m_opcode != Rem_I4) {
    bVar2 = instr->m_opcode == RemU_I4;
  }
  target = InsertLabel(true,instr);
  target_00 = InsertLabel(false,instr);
  target_01 = InsertLabel(false,instr->m_next);
  this_00 = IR::Instr::GetDst(instr);
  local_b8 = IR::Instr::GetSrc1(instr);
  testSrc1 = IR::Instr::GetSrc2(instr);
  pJVar7 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar7);
  if ((bVar3) && (!bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69ea,"(!isWasm || isRem)","!isWasm || isRem");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (!bVar3) {
    InsertTestBranch(testSrc1,testSrc1,BrEq_A,target,&target->super_Instr);
    IVar5 = IR::Opnd::GetType(this_00);
    pOVar8 = IR::IntConstOpnd::NewFromType(0,IVar5,this->m_func);
    InsertMove(this_00,pOVar8,&target_00->super_Instr,true);
    InsertBranch(Br,target_01,&target_00->super_Instr);
  }
  pOVar8 = IR::Instr::GetSrc1(instr);
  bVar3 = IR::Opnd::IsSigned(pOVar8);
  if (bVar3) {
    intMin = 0;
    IVar5 = IR::Opnd::GetType(local_b8);
    bVar3 = IRType_IsInt64(IVar5);
    value = -0x80000000;
    if (bVar3) {
      value = -0x8000000000000000;
    }
    bVar4 = IR::Opnd::IsImmediateOpnd(testSrc1);
    bVar3 = false;
    if (bVar4) {
      iVar9 = IR::Opnd::GetImmediateValue(testSrc1,this->m_func);
      bVar3 = iVar9 != -1;
    }
    bVar3 = (bool)(bVar3 ^ 1);
    bVar4 = IR::Opnd::IsImmediateOpnd(local_b8);
    if (bVar4) {
      if ((bVar3) && (iVar9 = IR::Opnd::GetImmediateValue(local_b8,this->m_func), iVar9 == value)) {
        intMin = (int64)InsertLabel(true,&target_00->super_Instr);
        InsertBranch(Br,(LabelInstr *)intMin,&target->super_Instr);
      }
      else {
        bVar3 = false;
      }
    }
    else if (bVar3) {
      intMin = (int64)InsertLabel(true,&target_00->super_Instr);
      IVar5 = IR::Opnd::GetType(local_b8);
      pOVar8 = IR::IntConstOpnd::NewFromType(value,IVar5,this->m_func);
      InsertCompareBranch(this,local_b8,pOVar8,BrEq_A,(LabelInstr *)intMin,&target->super_Instr,
                          false);
    }
    if (bVar3) {
      if (intMin == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6a0c,"(minIntLabel)","minIntLabel");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = IR::Opnd::IsImmediateOpnd(testSrc1);
      if ((bVar3) && (iVar9 = IR::Opnd::GetImmediateValue(testSrc1,this->m_func), iVar9 != -1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6a0d,
                           "(!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1)",
                           "!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar3 = IR::Opnd::IsImmediateOpnd(testSrc1);
      if (!bVar3) {
        IVar5 = IR::Opnd::GetType(testSrc1);
        pOVar8 = IR::IntConstOpnd::NewFromType(-1,IVar5,this->m_func);
        InsertCompareBranch(this,testSrc1,pOVar8,BrNeq_A,target_00,&target_00->super_Instr,false);
      }
      if (bVar2) {
        IVar5 = IR::Opnd::GetType(this_00);
        local_b8 = IR::IntConstOpnd::NewFromType(0,IVar5,this->m_func);
      }
      InsertMove(this_00,local_b8,&target_00->super_Instr,true);
      InsertBranch(Br,target_01,&target_00->super_Instr);
    }
  }
  InsertBranch(Br,target_00,&target->super_Instr);
  LowererMD::EmitInt4Instr(instr);
  return;
}

Assistant:

void
Lowerer::LowerDivI4Common(IR::Instr * instr)
{
    Assert(instr);
    Assert((instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) ||
        (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4));
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());

    const bool isRem = instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::RemU_I4;
    // MIN_INT/-1 path is only needed for signed operations

    //       TEST src2, src2
    //       JEQ $div0
    //       CMP src1, MIN_INT
    //       JEQ $minInt
    //       JMP $div
    // $div0: [helper]
    //       MOV dst, 0
    //       JMP $done
    // $minInt: [helper]
    //       CMP src2, -1
    //       JNE $div
    // dst = MOV src1 / 0
    //       JMP $done
    // $div:
    // dst = IDIV src2, src1
    // $done:

    IR::LabelInstr * div0Label = InsertLabel(true, instr);
    IR::LabelInstr * divLabel = InsertLabel(false, instr);
    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    Assert(!isWasm || isRem);

    if (!isWasm)
    {
        InsertTestBranch(src2, src2, Js::OpCode::BrEq_A, div0Label, div0Label);
        InsertMove(dst, IR::IntConstOpnd::NewFromType(0, dst->GetType(), m_func), divLabel);
        InsertBranch(Js::OpCode::Br, doneLabel, divLabel);
    }

    if (instr->GetSrc1()->IsSigned())
    {
        IR::LabelInstr * minIntLabel = nullptr;
        // we need to check for INT_MIN/-1 if divisor is either -1 or variable, and dividend is either INT_MIN or variable
        int64 intMin = IRType_IsInt64(src1->GetType()) ? LONGLONG_MIN : INT_MIN;
        bool needsMinOverNeg1Check = !(src2->IsImmediateOpnd() && src2->GetImmediateValue(m_func) != -1);
        if (src1->IsImmediateOpnd())
        {
            if (needsMinOverNeg1Check && src1->GetImmediateValue(m_func) == intMin)
            {
                minIntLabel = InsertLabel(true, divLabel);
                InsertBranch(Js::OpCode::Br, minIntLabel, div0Label);
            }
            else
            {
                needsMinOverNeg1Check = false;
            }
        }
        else if(needsMinOverNeg1Check)
        {
            minIntLabel = InsertLabel(true, divLabel);
            InsertCompareBranch(src1, IR::IntConstOpnd::NewFromType(intMin, src1->GetType(), m_func), Js::OpCode::BrEq_A, minIntLabel, div0Label);
        }
        if (needsMinOverNeg1Check)
        {
            Assert(minIntLabel);
            Assert(!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1);
            if (!src2->IsImmediateOpnd())
            {
                InsertCompareBranch(src2, IR::IntConstOpnd::NewFromType(-1, src2->GetType(), m_func), Js::OpCode::BrNeq_A, divLabel, divLabel);
            }

            InsertMove(dst, !isRem ? src1 : IR::IntConstOpnd::NewFromType(0, dst->GetType(), m_func), divLabel);
            InsertBranch(Js::OpCode::Br, doneLabel, divLabel);
        }
    }
    InsertBranch(Js::OpCode::Br, divLabel, div0Label);

    m_lowererMD.EmitInt4Instr(instr);
}